

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

void __thiscall MathInterpreter::separateInput(MathInterpreter *this,string *input_arg)

{
  char *pcVar1;
  ulong uVar2;
  undefined8 *puVar3;
  bool bVar4;
  uint local_54;
  uint local_50;
  uint count;
  uint start;
  allocator local_39;
  undefined1 local_38 [8];
  string temp;
  string *input_arg_local;
  MathInterpreter *this_local;
  
  temp.field_2._8_8_ = input_arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_50 = 0;
  local_54 = 0;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
  if ((((*pcVar1 == '-') && (uVar2 = std::__cxx11::string::size(), 1 < uVar2)) &&
      (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), *pcVar1 < ':')) &&
     (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), '/' < *pcVar1)) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
    std::__cxx11::string::operator+=((string *)local_38,*pcVar1);
    local_50 = 1;
    do {
      uVar2 = std::__cxx11::string::size();
      bVar4 = false;
      if (local_50 < uVar2) {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
        if (*pcVar1 < ':') {
          pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
          bVar4 = true;
          if ('/' < *pcVar1) goto LAB_0011ac78;
        }
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
        bVar4 = *pcVar1 == '.';
      }
LAB_0011ac78:
      if (!bVar4) goto LAB_0011ad26;
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
      if (*pcVar1 == '.') {
        local_54 = local_54 + 1;
      }
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
      std::__cxx11::string::operator+=((string *)local_38,*pcVar1);
      local_50 = local_50 + 1;
    } while( true );
  }
LAB_0011ad81:
  uVar2 = std::__cxx11::string::size();
  if (uVar2 <= local_50) {
    std::__cxx11::string::~string((string *)local_38);
    return;
  }
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
  if (((*pcVar1 < '{') &&
      (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), '`' < *pcVar1)) ||
     ((pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), *pcVar1 < '[' &&
      (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), '@' < *pcVar1)))) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
    std::__cxx11::string::operator+=((string *)local_38,*pcVar1);
    do {
      local_50 = local_50 + 1;
      uVar2 = std::__cxx11::string::size();
      bVar4 = false;
      if (local_50 < uVar2) {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
        if (*pcVar1 < '{') {
          pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
          bVar4 = true;
          if ('`' < *pcVar1) goto LAB_0011affb;
        }
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
        if (*pcVar1 < '[') {
          pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
          bVar4 = true;
          if ('@' < *pcVar1) goto LAB_0011affb;
        }
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
        bVar4 = true;
        if (*pcVar1 != '_') {
          pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
          bVar4 = false;
          if (*pcVar1 < ':') {
            pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
            bVar4 = '/' < *pcVar1;
          }
        }
      }
LAB_0011affb:
      if (!bVar4) goto LAB_0011b5f7;
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
      std::__cxx11::string::operator+=((string *)local_38,*pcVar1);
    } while( true );
  }
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
  if ((*pcVar1 < ':') &&
     (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), '/' < *pcVar1)) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
    std::__cxx11::string::operator+=((string *)local_38,*pcVar1);
    do {
      local_50 = local_50 + 1;
      uVar2 = std::__cxx11::string::size();
      bVar4 = false;
      if (local_50 < uVar2) {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
        if (*pcVar1 < ':') {
          pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
          bVar4 = true;
          if ('/' < *pcVar1) goto LAB_0011b18a;
        }
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
        bVar4 = *pcVar1 == '.';
      }
LAB_0011b18a:
      if (!bVar4) goto LAB_0011b1ff;
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
      if (*pcVar1 == '.') {
        local_54 = local_54 + 1;
      }
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
      std::__cxx11::string::operator+=((string *)local_38,*pcVar1);
    } while( true );
  }
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
  if ((((*pcVar1 != '(') &&
       (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), *pcVar1 != ')')) &&
      (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), *pcVar1 != '+')) &&
     (((pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), *pcVar1 != '-' &&
       (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), *pcVar1 != '*')) &&
      (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), *pcVar1 != '/')))) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "invalid input_arg2";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
  if (((*pcVar1 == '-') && (uVar2 = std::__cxx11::string::size(), local_50 + 1 < uVar2)) &&
     ((local_50 != 0 &&
      (((pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), *pcVar1 == '(' &&
        (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), *pcVar1 < ':')) &&
       (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg), '/' < *pcVar1)))))) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
    std::__cxx11::string::operator+=((string *)local_38,*pcVar1);
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
    std::__cxx11::string::operator+=((string *)local_38,*pcVar1);
    local_50 = local_50 + 2;
    do {
      uVar2 = std::__cxx11::string::size();
      bVar4 = false;
      if (local_50 < uVar2) {
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
        if (*pcVar1 < ':') {
          pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
          bVar4 = true;
          if ('/' < *pcVar1) goto LAB_0011b51c;
        }
        pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
        bVar4 = *pcVar1 == '.';
      }
LAB_0011b51c:
      if (!bVar4) goto LAB_0011b5f7;
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
      if (*pcVar1 == '.') {
        local_54 = local_54 + 1;
      }
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
      std::__cxx11::string::operator+=((string *)local_38,*pcVar1);
      local_50 = local_50 + 1;
    } while( true );
  }
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)input_arg);
  std::__cxx11::string::operator+=((string *)local_38,*pcVar1);
  local_50 = local_50 + 1;
  goto LAB_0011b5f7;
LAB_0011ad26:
  if (1 < local_54) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "Invalid input";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this->input,(value_type *)local_38);
  std::__cxx11::string::operator=((string *)local_38,"");
  goto LAB_0011ad81;
LAB_0011b1ff:
  if (1 < local_54) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "invalid input_arg3";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
LAB_0011b5f7:
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this->input,(value_type *)local_38);
  std::__cxx11::string::operator=((string *)local_38,"");
  goto LAB_0011ad81;
}

Assistant:

void MathInterpreter::separateInput(string input_arg) {//-rol/70
  string temp = "";
  unsigned int start = 0, count = 0;
  //check negative number in begining of string
  if ((input_arg[start] == '-') && (input_arg.size() > 1)
      && (input_arg[1] <= '9') && (input_arg[1] >= '0')) {
    temp += input_arg[start];
    start++;
    while ((start < input_arg.size())
        && (((input_arg[start] <= '9') && (input_arg[start] >= '0'))
            || (input_arg[start] == '.'))) {
      if (input_arg[start] == '.') {
        count++;
      }
      temp += input_arg[start];
      start++;
    }
    if (count > 1) {
      throw ("Invalid input");
    }
    this->input->push_back(temp);
    temp = "";
  }
  while (start < input_arg.size()) {
    if (((input_arg[start] <= 'z') && (input_arg[start] >= 'a'))
        || ((input_arg[start] <= 'Z') && (input_arg[start] >= 'A'))) {
      temp += input_arg[start];
      start++;
      while (start < input_arg.size()
          && (((input_arg[start] <= 'z') && (input_arg[start] >= 'a'))
              || ((input_arg[start] <= 'Z') && (input_arg[start] >= 'A'))
              || (input_arg[start] == '_')
              || ((input_arg[start] <= '9') && (input_arg[start] >= '0')))) {
        temp += input_arg[start];
        start++;
      }
    } else if ((input_arg[start] <= '9') && (input_arg[start] >= '0')) {
      temp += input_arg[start];
      start++;
      while ((start < input_arg.size())
          && (((input_arg[start] <= '9') && (input_arg[start] >= '0'))
              || (input_arg[start] == '.'))) {
        if (input_arg[start] == '.') {
          count++;
        }
        temp += input_arg[start];
        start++;
      }
      if (count > 1) {
        throw ("invalid input_arg3");
      }
    } else if ((input_arg[start] == '(') || (input_arg[start] == ')')
        || (input_arg[start] == '+') || (input_arg[start] == '-')
        || (input_arg[start] == '*') || (input_arg[start] == '/')) {
      //check for negative number in input_arg
      if ((input_arg[start] == '-') && (input_arg.size() > start + 1)
          && (start > 0) && (input_arg[start - 1] == '(')
          && (input_arg[start + 1] <= '9') && (input_arg[start + 1] >= '0')) {
        temp += (input_arg[start]);
        start++;
        temp += (input_arg[start]);
        start++;
        while ((start < input_arg.size())
            && (((input_arg[start] <= '9') && (input_arg[start] >= '0'))
                || (input_arg[start] == '.'))) {
          if (input_arg[start] == '.') {
            count++;
          }
          temp += input_arg[start];
          start++;
        }
      } else {
        temp += input_arg[start];
        start++;
      }
    } else {
      throw ("invalid input_arg2");
    }
    this->input->push_back(temp);
    temp = "";
  }
}